

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_bct64(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  _Bool is_imm_00;
  int iVar1;
  DisasJumpType DVar2;
  int local_4c;
  undefined1 local_48 [8];
  DisasCompare_conflict2 c;
  int imm;
  _Bool is_imm;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  is_imm_00 = have_field1(s,FLD_O_i2);
  if (is_imm_00) {
    local_4c = get_field1(s,FLD_O_i2,FLD_C_b2);
  }
  else {
    local_4c = 0;
  }
  c.u._12_4_ = local_4c;
  local_48[0] = 9;
  local_48[1] = true;
  local_48[2] = true;
  local_48[3] = false;
  tcg_gen_subi_i64_s390x(tcg_ctx_00,tcg_ctx_00->regs[iVar1],tcg_ctx_00->regs[iVar1],1);
  c._0_8_ = tcg_ctx_00->regs[iVar1];
  c.u.s64.a = tcg_const_i64_s390x(tcg_ctx_00,0);
  DVar2 = help_branch(s,(DisasCompare_conflict2 *)local_48,is_imm_00,c.u._12_4_,o->in2);
  return DVar2;
}

Assistant:

static DisasJumpType op_bct64(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    bool is_imm = have_field(s, i2);
    int imm = is_imm ? get_field(s, i2) : 0;
    DisasCompare c;

    c.cond = TCG_COND_NE;
    c.is_64 = true;
    c.g1 = true;
    c.g2 = false;

    tcg_gen_subi_i64(tcg_ctx, tcg_ctx->regs[r1], tcg_ctx->regs[r1], 1);
    c.u.s64.a = tcg_ctx->regs[r1];
    c.u.s64.b = tcg_const_i64(tcg_ctx, 0);

    return help_branch(s, &c, is_imm, imm, o->in2);
}